

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O1

int Am_Center_Y_Is_Center_Of_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object center_y_obj;
  Am_Object local_20;
  
  pAVar5 = Am_Object::Get(self,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  local_20.data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(self,0xb4,0);
  Am_Object::operator=(&local_20,pAVar5);
  bVar1 = Am_Object::Valid(&local_20);
  iVar3 = 0;
  if (bVar1) {
    pAVar5 = Am_Object::Get(&local_20,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(&local_20,0x67,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    iVar3 = (iVar4 - iVar2) / 2 + iVar3;
  }
  Am_Object::~Am_Object(&local_20);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, Am_Center_Y_Is_Center_Of)
{
  int my_height = self.Get(Am_HEIGHT);
  Am_Object center_y_obj;
  center_y_obj = self.Get(Am_CENTER_Y_OBJ);
  if (center_y_obj.Valid()) {
    int center_y_obj_top = center_y_obj.Get(Am_TOP);
    int center_y_obj_height = center_y_obj.Get(Am_HEIGHT);
    return center_y_obj_top + ((center_y_obj_height - my_height) / 2);
  } else {
    return 0;
  }
}